

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void ungroup_objects_internal
               (Am_Object *cmd,Am_Object *selection_widget,Am_Value_List *selected_objs,
               Am_Object *group)

{
  Am_Object *prev;
  bool bVar1;
  int left_offset;
  int top_offset;
  Am_Wrapper *pAVar2;
  Am_Value *pAVar3;
  Am_Object place;
  Am_Value_List sub_group_parts;
  Am_Object sub_group;
  Am_Value_List new_selected_objs;
  Am_Object obj;
  Am_Value_List selected_objs_places;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Value_List local_d0;
  Am_Object local_c0;
  Am_Object *local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Value_List local_90;
  Am_Object local_80;
  Am_Value_List local_78;
  Am_Object local_68;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  
  local_80.data = (Am_Object_Data *)0x0;
  local_f0.data = (Am_Object_Data *)0x0;
  local_c0.data = (Am_Object_Data *)0x0;
  local_b8 = selection_widget;
  Am_Value_List::Am_Value_List(&local_78);
  Am_Value_List::Am_Value_List(&local_d0);
  Am_Value_List::Am_Value_List(&local_90);
  Am_Object::Am_Object(&local_d8,cmd);
  Am_Get_Selection_Widget_For_Command(&local_f8);
  prev = local_b8;
  Am_Object::operator=(local_b8,&local_f8);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::Am_Object(&local_e0,prev);
  Am_Get_Selection_In_Display_Order(&local_e0,selected_objs,group);
  Am_Object::~Am_Object(&local_e0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(selected_objs);
  Am_Object::Set(cmd,0x16d,pAVar2,0);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(group);
  Am_Object::Set(cmd,0x171,pAVar2,0);
  Am_Object::Set(cmd,0x16f,false,0);
  Am_Value_List::Start(selected_objs);
  while( true ) {
    bVar1 = Am_Value_List::Last(selected_objs);
    if (bVar1) break;
    pAVar3 = Am_Value_List::Get(selected_objs);
    Am_Object::operator=(&local_c0,pAVar3);
    pAVar3 = Am_Object::Get(&local_c0,100,0);
    left_offset = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(&local_c0,0x65,0);
    top_offset = Am_Value::operator_cast_to_int(pAVar3);
    Am_Object::Am_Object(&local_e8,&local_c0);
    Am_Object::Am_Object(&local_98,group);
    Am_Find_Part_Place(&local_f8,&local_e8);
    Am_Object::operator=(&local_f0,&local_f8);
    Am_Object::~Am_Object(&local_f8);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&local_e8);
    pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_f0);
    Am_Value_List::Add(&local_78,pAVar2,Am_TAIL,true);
    pAVar3 = Am_Object::Get(&local_c0,0x82,0);
    Am_Value_List::operator=(&local_d0,pAVar3);
    pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_d0);
    Am_Object::Set(&local_c0,0x1e4,pAVar2,1);
    Am_Value_List::Am_Value_List(&local_40,&local_d0);
    adjust_objects_positions(&local_40,left_offset,top_offset);
    Am_Value_List::~Am_Value_List(&local_40);
    Am_Value_List::Am_Value_List(&local_50,&local_d0);
    Am_Object::Am_Object(&local_a0,&local_c0);
    Am_Object::Am_Object(&local_a8,group);
    Am_Object::Am_Object(&local_68,&local_f0);
    remove_and_add_objects(&local_50,&local_a0,&local_a8,&local_68);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_a8);
    Am_Object::~Am_Object(&local_a0);
    Am_Value_List::~Am_Value_List(&local_50);
    Am_Value_List::Am_Value_List(&local_60,&local_d0);
    Am_Value_List::Append(&local_90,&local_60,true);
    Am_Value_List::~Am_Value_List(&local_60);
    Am_Object::Am_Object(&local_b0,&local_c0);
    Am_Object::Remove_Part(group,&local_b0);
    Am_Object::~Am_Object(&local_b0);
    Am_Value_List::Next(selected_objs);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_78);
  Am_Object::Set(cmd,0x1e4,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_90);
  Am_Object::Set(cmd,0x169,pAVar2,0);
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_90);
  Am_Object::Set(local_b8,0x169,pAVar2,0);
  Am_Value_List::~Am_Value_List(&local_90);
  Am_Value_List::~Am_Value_List(&local_d0);
  Am_Value_List::~Am_Value_List(&local_78);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_80);
  return;
}

Assistant:

void
ungroup_objects_internal(Am_Object &cmd, Am_Object &selection_widget,
                         Am_Value_List &selected_objs, Am_Object &group)
{
  Am_Object obj, place, sub_group;
  int left, top;
  Am_Value_List selected_objs_places, sub_group_parts, new_selected_objs;
  selection_widget = Am_Get_Selection_Widget_For_Command(cmd);
  Am_Get_Selection_In_Display_Order(selection_widget, selected_objs, group);
  cmd.Set(Am_OBJECT_MODIFIED, selected_objs);
  cmd.Set(Am_SAVED_OLD_OBJECT_OWNER, group);
  cmd.Set(Am_HAS_BEEN_UNDONE, false);

  for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
    sub_group = selected_objs.Get();
    left = sub_group.Get(Am_LEFT);
    top = sub_group.Get(Am_TOP);
    place = Am_Find_Part_Place(sub_group, group);
    selected_objs_places.Add(place);

    // now take out the pieces
    sub_group_parts = sub_group.Get(Am_GRAPHICAL_PARTS);
    //save a copy in case undo
    sub_group.Set(Am_OBJECT_MODIFIED_PLACES, sub_group_parts,
                  Am_OK_IF_NOT_THERE);
    adjust_objects_positions(sub_group_parts, left, top);
    remove_and_add_objects(sub_group_parts, sub_group, group, place);
    new_selected_objs.Append(sub_group_parts);
    group.Remove_Part(sub_group);
  }

  cmd.Set(Am_OBJECT_MODIFIED_PLACES, selected_objs_places);
  cmd.Set(Am_VALUE, new_selected_objs); //all the objects affected
  //new selection is all the objects taken out of groups
  selection_widget.Set(Am_VALUE, new_selected_objs);
}